

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O2

int Gia_ManBuiltInSimCheckOver(Gia_Man_t *p,int iLit0,int iLit1)

{
  ulong *puVar1;
  ulong *puVar2;
  int iVar3;
  int iVar4;
  word *pwVar5;
  word *pwVar6;
  ulong uVar7;
  ulong uVar8;
  
  iVar3 = Abc_Lit2Var(iLit0);
  pwVar5 = Gia_ManBuiltInData(p,iVar3);
  iVar3 = Abc_Lit2Var(iLit1);
  pwVar6 = Gia_ManBuiltInData(p,iVar3);
  if ((p->fBuiltInSim == 0) && (p->fIncrSim == 0)) {
    __assert_fail("p->fBuiltInSim || p->fIncrSim",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSim.c"
                  ,0x35f,"int Gia_ManBuiltInSimCheckOver(Gia_Man_t *, int, int)");
  }
  iVar3 = Abc_LitIsCompl(iLit0);
  iVar4 = Abc_LitIsCompl(iLit1);
  uVar7 = 0;
  if (0 < p->nSimWords) {
    uVar7 = (ulong)(uint)p->nSimWords;
  }
  if (iVar3 == 0) {
    if (iVar4 == 0) {
      uVar8 = 0;
      do {
        if (uVar7 == uVar8) {
          return 0;
        }
        puVar1 = pwVar6 + uVar8;
        puVar2 = pwVar5 + uVar8;
        uVar8 = uVar8 + 1;
      } while ((*puVar2 & *puVar1) == 0);
    }
    else {
      uVar8 = 0;
      do {
        if (uVar7 == uVar8) {
          return 0;
        }
        puVar1 = pwVar6 + uVar8;
        puVar2 = pwVar5 + uVar8;
        uVar8 = uVar8 + 1;
      } while ((*puVar2 & ~*puVar1) == 0);
    }
  }
  else if (iVar4 == 0) {
    uVar8 = 0;
    do {
      if (uVar7 == uVar8) {
        return 0;
      }
      puVar1 = pwVar5 + uVar8;
      puVar2 = pwVar6 + uVar8;
      uVar8 = uVar8 + 1;
    } while ((*puVar2 & ~*puVar1) == 0);
  }
  else {
    uVar8 = 0;
    do {
      if (uVar7 == uVar8) {
        return 0;
      }
      puVar1 = pwVar6 + uVar8;
      puVar2 = pwVar5 + uVar8;
      uVar8 = uVar8 + 1;
    } while ((*puVar1 | *puVar2) == 0xffffffffffffffff);
  }
  return 1;
}

Assistant:

int Gia_ManBuiltInSimCheckOver( Gia_Man_t * p, int iLit0, int iLit1 )
{
    word * pInfo0 = Gia_ManBuiltInData( p, Abc_Lit2Var(iLit0) );
    word * pInfo1 = Gia_ManBuiltInData( p, Abc_Lit2Var(iLit1) ); int w;
    assert( p->fBuiltInSim || p->fIncrSim );

//    printf( "%d %d\n", Abc_LitIsCompl(iLit0), Abc_LitIsCompl(iLit1) );
//    Extra_PrintBinary( stdout, pInfo0, 64*p->nSimWords ); printf( "\n" );
//    Extra_PrintBinary( stdout, pInfo1, 64*p->nSimWords ); printf( "\n" );
//    printf( "\n" );

    if ( Abc_LitIsCompl(iLit0) )
    {
        if (  Abc_LitIsCompl(iLit1) )
        {
            for ( w = 0; w < p->nSimWords; w++ )
                if ( ~pInfo0[w] & ~pInfo1[w] )
                    return 1;
        }
        else 
        {
            for ( w = 0; w < p->nSimWords; w++ )
                if ( ~pInfo0[w] & pInfo1[w] )
                    return 1;
        }
    }
    else 
    {
        if (  Abc_LitIsCompl(iLit1) )
        {
            for ( w = 0; w < p->nSimWords; w++ )
                if ( pInfo0[w] & ~pInfo1[w] )
                    return 1;
        }
        else 
        {
            for ( w = 0; w < p->nSimWords; w++ )
                if ( pInfo0[w] & pInfo1[w] )
                    return 1;
        }
    }
    return 0;
}